

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O0

int Jf_CutAreaRef_rec(Jf_Man_t *p,int *pCut)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int local_24;
  int local_20;
  int Count;
  int Var;
  int i;
  int *pCut_local;
  Jf_Man_t *p_local;
  
  local_24 = Jf_CutCost(pCut);
  Count = 1;
  while( true ) {
    iVar1 = Jf_CutSize(pCut);
    bVar3 = false;
    if (Count <= iVar1) {
      local_20 = Jf_CutVar(pCut,Count);
      bVar3 = local_20 != 0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjRefIncId(p->pGia,local_20);
    if (iVar1 == 0) {
      piVar2 = Jf_ObjCutBest(p,local_20);
      iVar1 = Jf_CutIsTriv(piVar2,local_20);
      if (iVar1 == 0) {
        piVar2 = Jf_ObjCutBest(p,local_20);
        iVar1 = Jf_CutAreaRef_rec(p,piVar2);
        local_24 = iVar1 + local_24;
      }
    }
    Vec_IntPush(p->vTemp,local_20);
    Count = Count + 1;
  }
  return local_24;
}

Assistant:

int Jf_CutAreaRef_rec( Jf_Man_t * p, int * pCut )
{
    int i, Var, Count = Jf_CutCost(pCut);
    Jf_CutForEachVar( pCut, Var, i )
    {
        if ( !Gia_ObjRefIncId(p->pGia, Var) && !Jf_CutIsTriv(Jf_ObjCutBest(p, Var), Var) )
            Count += Jf_CutAreaRef_rec( p, Jf_ObjCutBest(p, Var) );
        Vec_IntPush( p->vTemp, Var );
    }
    return Count;
}